

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-async.c
# Opt level: O0

void worker_async_cb(uv_async_t *handle)

{
  int iVar1;
  ctx *ctx;
  uv_async_t *handle_local;
  
  iVar1 = uv_async_send(handle + -1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-async.c"
            ,0x2e,"0 == uv_async_send(&ctx->main_async)");
    abort();
  }
  *(int *)((long)&handle[1].loop + 4) = *(int *)((long)&handle[1].loop + 4) + 1;
  handle[1].type = handle[1].type + UV_ASYNC;
  if (999999 < *(uint *)((long)&handle[1].loop + 4)) {
    uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  }
  return;
}

Assistant:

static void worker_async_cb(uv_async_t* handle) {
  struct ctx* ctx = container_of(handle, struct ctx, worker_async);

  ASSERT(0 == uv_async_send(&ctx->main_async));
  ctx->worker_sent++;
  ctx->worker_seen++;

  if (ctx->worker_sent >= NUM_PINGS)
    uv_close((uv_handle_t*) &ctx->worker_async, NULL);
}